

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldGenerator::GenerateParsingCode
          (ImmutableMessageOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  Type TVar1;
  char *text;
  
  variables = &(this->super_ImmutableMessageFieldGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "$type$.Builder subBuilder = null;\nif ($has_oneof_case_message$) {\n  subBuilder = (($type$) $oneof_name$_).toBuilder();\n}\n"
                    );
  TVar1 = GetType((this->super_ImmutableMessageFieldGenerator).descriptor_);
  text = "$oneof_name$_ =\n    input.readMessage($type$.$get_parser$, extensionRegistry);\n";
  if (TVar1 == TYPE_GROUP) {
    text = 
    "$oneof_name$_ = input.readGroup($number$, $type$.$get_parser$,\n    extensionRegistry);\n";
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Print(printer,variables,
                     "if (subBuilder != null) {\n  subBuilder.mergeFrom(($type$) $oneof_name$_);\n  $oneof_name$_ = subBuilder.buildPartial();\n}\n"
                    );
  io::Printer::Print(printer,variables,"$set_oneof_case_message$;\n");
  return;
}

Assistant:

void ImmutableMessageOneofFieldGenerator::GenerateParsingCode(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "$type$.Builder subBuilder = null;\n"
                 "if ($has_oneof_case_message$) {\n"
                 "  subBuilder = (($type$) $oneof_name$_).toBuilder();\n"
                 "}\n");

  if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
    printer->Print(
        variables_,
        "$oneof_name$_ = input.readGroup($number$, $type$.$get_parser$,\n"
        "    extensionRegistry);\n");
  } else {
    printer->Print(
        variables_,
        "$oneof_name$_ =\n"
        "    input.readMessage($type$.$get_parser$, extensionRegistry);\n");
  }

  printer->Print(variables_,
                 "if (subBuilder != null) {\n"
                 "  subBuilder.mergeFrom(($type$) $oneof_name$_);\n"
                 "  $oneof_name$_ = subBuilder.buildPartial();\n"
                 "}\n");
  printer->Print(variables_, "$set_oneof_case_message$;\n");
}